

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::OP_SetProperty
               (Var instance,PropertyId propertyId,Var newValue,ScriptContext *scriptContext,
               PropertyValueInfo *info,PropertyOperationFlags flags,Var thisInstance)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  RecyclableObject *object;
  PropertyRecord *pPVar7;
  
  if (thisInstance == (Var)0x0) {
    thisInstance = instance;
  }
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_0099b34b;
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(instance);
  if ((ulong)instance >> 0x32 == 0 && !bVar3) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(instance);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0099b34b;
      *puVar5 = 0;
    }
    TVar1 = ((pRVar6->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if ((int)TVar1 < 2) {
        bVar3 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
        if (!bVar3) {
          return 1;
        }
        pPVar7 = ScriptContext::GetPropertyName(scriptContext,propertyId);
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec49,(PCWSTR)(pPVar7 + 1));
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(pRVar6);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_0099b34b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  bVar3 = TaggedNumber::Is(instance);
  if ((!bVar3) && (bVar3 = TaggedNumber::Is(thisInstance), !bVar3)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(thisInstance);
    object = UnsafeVarTo<Js::RecyclableObject>(instance);
    BVar4 = SetProperty(pRVar6,object,propertyId,newValue,info,scriptContext,flags);
    return BVar4;
  }
  JavascriptError::ThrowCantAssignIfStrictMode(flags,scriptContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::OP_SetProperty(Var instance, PropertyId propertyId, Var newValue, ScriptContext* scriptContext, PropertyValueInfo * info, PropertyOperationFlags flags, Var thisInstance)
    {
        // The call into ToObject(dynamicObject) is avoided here by checking for null and undefined and doing nothing when dynamicObject is a primitive value.
        if (thisInstance == nullptr)
        {
            thisInstance = instance;
        }
        TypeId typeId = JavascriptOperators::GetTypeId(instance);

        if (JavascriptOperators::IsUndefinedOrNullType(typeId))
        {
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotSet_NullOrUndefined, scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            return TRUE;
        }

        if (!TaggedNumber::Is(instance) && !TaggedNumber::Is(thisInstance))
        {
            return JavascriptOperators::SetProperty(UnsafeVarTo<RecyclableObject>(thisInstance), UnsafeVarTo<RecyclableObject>(instance), propertyId, newValue, info, scriptContext, flags);
        }

        JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);
        return false;
    }